

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

void twice_cb(uv_timer_t *handle)

{
  int iVar1;
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_timer_t *handle_local;
  
  printf("TWICE_CB %d\n",(ulong)(uint)twice_cb_called);
  if (handle == (uv_timer_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x4d,"handle","!=","NULL",0,"!=",0);
    abort();
  }
  iVar1 = uv_is_active((uv_handle_t *)handle);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x4e,"uv_is_active((uv_handle_t*) handle)","==","0",(long)iVar1,"==",0);
    abort();
  }
  twice_cb_called = twice_cb_called + 1;
  uv_close((uv_handle_t *)handle,twice_close_cb);
  return;
}

Assistant:

static void twice_cb(uv_timer_t* handle) {
  printf("TWICE_CB %d\n", twice_cb_called);

  ASSERT_NOT_NULL(handle);
  ASSERT_OK(uv_is_active((uv_handle_t*) handle));

  twice_cb_called++;

  uv_close((uv_handle_t*)handle, twice_close_cb);
}